

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanInstance.cpp
# Opt level: O0

string * __thiscall
VulkanUtilities::PrintExtensionsList_abi_cxx11_
          (string *__return_storage_ptr__,VulkanUtilities *this,
          vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *Extensions,
          size_t NumColumns)

{
  unsigned_long uVar1;
  size_t sVar2;
  undefined8 __n;
  bool bVar3;
  _Setw _Var4;
  Char *Message;
  size_type sVar5;
  reference pvVar6;
  unsigned_long *puVar7;
  ostream *poVar8;
  reference pvVar9;
  char *pcVar10;
  size_type local_400;
  size_t col_1;
  size_t i_1;
  stringstream ss;
  ostream local_3e0 [376];
  unsigned_long local_268;
  ulong local_260;
  size_t col;
  size_t i;
  undefined1 local_248 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> ColWidth;
  stringstream local_210 [8];
  stringstream ss_1;
  ostream local_200 [376];
  reference local_88;
  VkExtensionProperties *Ext;
  const_iterator __end1;
  const_iterator __begin1;
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *__range1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ExtStrings;
  undefined1 local_40 [8];
  string msg;
  size_t NumColumns_local;
  vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *Extensions_local;
  
  msg.field_2._8_8_ = Extensions;
  if (Extensions == (vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)0x0) {
    Diligent::FormatString<char[26],char[15]>
              ((string *)local_40,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"NumColumns > 0",(char (*) [15])NumColumns);
    Message = (Char *)std::__cxx11::string::c_str();
    Diligent::DebugAssertionFailed
              (Message,"PrintExtensionsList",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/VulkanInstance.cpp"
               ,0x3c);
    std::__cxx11::string::~string((string *)local_40);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&__range1);
  sVar5 = std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::size
                    ((vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)this);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__range1,sVar5);
  __end1 = std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::begin
                     ((vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)this)
  ;
  Ext = (VkExtensionProperties *)
        std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::end
                  ((vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)this);
  while (bVar3 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_VkExtensionProperties_*,_std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>_>
                                     *)&Ext), __n = msg.field_2._8_8_, bVar3) {
    local_88 = __gnu_cxx::
               __normal_iterator<const_VkExtensionProperties_*,_std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>_>
               ::operator*(&__end1);
    std::__cxx11::stringstream::stringstream(local_210);
    poVar8 = std::operator<<(local_200,local_88->extensionName);
    poVar8 = std::operator<<(poVar8,' ');
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_88->specVersion >> 0x16 & 0x7f);
    poVar8 = std::operator<<(poVar8,'.');
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,local_88->specVersion >> 0xc & 0x3ff);
    poVar8 = std::operator<<(poVar8,'.');
    std::ostream::operator<<(poVar8,local_88->specVersion & 0xfff);
    std::__cxx11::stringstream::str();
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&__range1,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &ColWidth.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::string::~string
              ((string *)
               &ColWidth.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::stringstream::~stringstream(local_210);
    __gnu_cxx::
    __normal_iterator<const_VkExtensionProperties_*,_std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>_>
    ::operator++(&__end1);
  }
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)((long)&i + 7));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_248,__n,
             (allocator<unsigned_long> *)((long)&i + 7));
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)((long)&i + 7));
  col = 0;
  while (sVar2 = col,
        sVar5 = std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::size
                          ((vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)
                           this), sVar2 < sVar5) {
    local_260 = 0;
    while( true ) {
      sVar2 = col;
      bVar3 = false;
      if (local_260 < (ulong)msg.field_2._8_8_) {
        sVar5 = std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::size
                          ((vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)
                           this);
        bVar3 = sVar2 < sVar5;
      }
      if (!bVar3) break;
      pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_248,
                          local_260);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range1,col);
      local_268 = std::__cxx11::string::length();
      puVar7 = std::max<unsigned_long>(pvVar6,&local_268);
      uVar1 = *puVar7;
      pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_248,
                          local_260);
      *pvVar6 = uVar1;
      local_260 = local_260 + 1;
      col = col + 1;
    }
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&i_1);
  col_1 = 0;
  while (sVar5 = std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::size
                           ((vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *
                            )this), col_1 < sVar5) {
    local_400 = 0;
    while( true ) {
      bVar3 = false;
      if (local_400 < (ulong)msg.field_2._8_8_) {
        sVar5 = std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::size
                          ((vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_> *)
                           this);
        bVar3 = col_1 < sVar5;
      }
      if (!bVar3) break;
      pcVar10 = "    ";
      if (local_400 == 0) {
        pcVar10 = "\n    ";
      }
      std::operator<<(local_3e0,pcVar10);
      if ((local_400 + 1 < (ulong)msg.field_2._8_8_) &&
         (sVar5 = std::vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>::size
                            ((vector<VkExtensionProperties,_std::allocator<VkExtensionProperties>_>
                              *)this), col_1 + 1 < sVar5)) {
        pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_248,
                            local_400);
        _Var4 = std::setw((int)*pvVar6);
        poVar8 = std::operator<<(local_3e0,_Var4);
        std::ostream::operator<<(poVar8,std::left);
      }
      pvVar9 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&__range1,col_1);
      std::operator<<(local_3e0,(string *)pvVar9);
      local_400 = local_400 + 1;
      col_1 = col_1 + 1;
    }
  }
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&i_1);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_248);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&__range1);
  return __return_storage_ptr__;
}

Assistant:

std::string PrintExtensionsList(const std::vector<VkExtensionProperties>& Extensions, size_t NumColumns)
{
    VERIFY_EXPR(NumColumns > 0);

    std::vector<std::string> ExtStrings;
    ExtStrings.reserve(Extensions.size());
    for (const auto& Ext : Extensions)
    {
        std::stringstream ss;
        ss << Ext.extensionName << ' '
           << VK_API_VERSION_MAJOR(Ext.specVersion) << '.'
           << VK_API_VERSION_MINOR(Ext.specVersion) << '.'
           << VK_API_VERSION_PATCH(Ext.specVersion);
        ExtStrings.emplace_back(ss.str());
    }

    std::vector<size_t> ColWidth(NumColumns);
    for (size_t i = 0; i < Extensions.size();)
    {
        for (size_t col = 0; col < NumColumns && i < Extensions.size(); ++col, ++i)
        {
            ColWidth[col] = std::max(ColWidth[col], ExtStrings[i].length());
        }
    }

    std::stringstream ss;
    for (size_t i = 0; i < Extensions.size();)
    {
        for (size_t col = 0; col < NumColumns && i < Extensions.size(); ++col, ++i)
        {
            ss << (col == 0 ? "\n    " : "    ");
            if (col + 1 < NumColumns && i + 1 < Extensions.size())
                ss << std::setw(static_cast<int>(ColWidth[col])) << std::left;
            ss << ExtStrings[i];
        }
    }

    return ss.str();
}